

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

uint32_t * __thiscall
google::protobuf::Reflection::MutableInlinedStringDonatedArray(Reflection *this,Message *message)

{
  Message *message_00;
  bool bVar1;
  uint32_t offset;
  LogMessage *pLVar2;
  uint *puVar3;
  LogMessage local_30;
  Voidify local_19;
  Message *local_18;
  Message *message_local;
  Reflection *this_local;
  
  local_18 = message;
  message_local = (Message *)this;
  bVar1 = internal::ReflectionSchema::HasInlinedString(&this->schema_);
  message_00 = local_18;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    offset = internal::ReflectionSchema::InlinedStringDonatedOffset(&this->schema_);
    puVar3 = internal::GetPointerAtOffset<unsigned_int>(message_00,offset);
    return puVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xbba,"schema_.HasInlinedString()");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

uint32_t* Reflection::MutableInlinedStringDonatedArray(Message* message) const {
  ABSL_DCHECK(schema_.HasInlinedString());
  return GetPointerAtOffset<uint32_t>(message,
                                      schema_.InlinedStringDonatedOffset());
}